

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

uint32 __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UnescapeToTempBuf
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last)

{
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  undefined4 *puVar4;
  uint ch;
  EncodedCharPtr local_48;
  EncodedCharPtr p_local;
  uint uStack_38;
  char16 upper;
  codepoint_t codePoint;
  char16 lower;
  bool isMultiChar;
  
  (this->m_tempChBuf).m_ichCur = 0;
  if (p < last) {
    local_48 = p;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                        (&this->super_UTF8EncodingPolicyBase<false>,&local_48,last);
      uStack_38 = (uint)(ushort)OVar3;
      if (uStack_38 < 0x80) {
        if ((ushort)OVar3 == 0x5c) {
          TryReadEscape(this,&local_48,last,&stack0xffffffffffffffc8);
        }
LAB_00f17dc1:
        p_local._4_4_ = uStack_38;
      }
      else {
        codePoint._3_1_ = 1;
        if (this->es6UnicodeMode != true) goto LAB_00f17dc1;
        bVar2 = Js::NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar3);
        if (!bVar2) goto LAB_00f17dc1;
        bVar2 = TryReadCodePointRest<false>
                          (this,uStack_38,&local_48,last,(codepoint_t *)((long)&p_local + 4),
                           (bool *)((long)&codePoint + 3));
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                             ,0x22c,"(gotCodePoint)","gotCodePoint");
          if (!bVar2) goto LAB_00f17e63;
          *puVar4 = 0;
        }
      }
      if (0x10ffff < p_local._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x22d,"(codePoint < 0x110000)","codePoint < 0x110000");
        if (!bVar2) {
LAB_00f17e63:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      ch = p_local._4_4_;
      if (0xffff < p_local._4_4_) {
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (p_local._4_4_,(char16 *)&stack0xffffffffffffffc8,(char16 *)((long)&p_local + 2));
        TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,uStack_38 & 0xffff);
        ch = (uint)p_local._2_2_;
      }
      TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,ch);
    } while (local_48 < last);
  }
  return (this->m_tempChBuf).m_ichCur;
}

Assistant:

uint32 Scanner<EncodingPolicy>::UnescapeToTempBuf(EncodedCharPtr p, EncodedCharPtr last)
{
    m_tempChBuf.Reset();
    while( p < last )
    {
        codepoint_t codePoint;
        bool hasEscape, isMultiChar;
        bool gotCodePoint = TryReadCodePoint<false>(p, last, &codePoint, &hasEscape, &isMultiChar);
        Assert(gotCodePoint);
        Assert(codePoint < 0x110000);
        if (codePoint < 0x10000)
        {
            m_tempChBuf.AppendCh((OLECHAR)codePoint);
        }
        else
        {
            char16 lower, upper;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);
            m_tempChBuf.AppendCh(lower);
            m_tempChBuf.AppendCh(upper);
        }
    }
    return m_tempChBuf.m_ichCur;
}